

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O1

void WriteF0(char *filename,int f0_length,double frame_period,double *temporal_positions,double *f0,
            int text_flag)

{
  FILE *__s;
  ulong uVar1;
  double local_38;
  
  if (text_flag == 1) {
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
LAB_0010bdf1:
      puts("File cannot be opened.");
      return;
    }
    if (0 < f0_length) {
      uVar1 = 0;
      do {
        fprintf(__s,"%.5f %.5f\r\n",temporal_positions[uVar1],f0[uVar1]);
        uVar1 = uVar1 + 1;
      } while ((uint)f0_length != uVar1);
    }
  }
  else {
    __s = fopen(filename,"wb");
    if (__s == (FILE *)0x0) goto LAB_0010bdf1;
    fwrite("F0  ",1,4,__s);
    anon_unknown.dwarf_ce08::WriteOneParameter((FILE *)__s,"NOF ",(double)f0_length,4);
    local_38 = frame_period;
    fwrite("FP  ",1,4,__s);
    fwrite(&local_38,8,1,__s);
    fwrite(f0,8,(long)f0_length,__s);
  }
  fclose(__s);
  return;
}

Assistant:

void WriteF0(const char *filename, int f0_length, double frame_period,
    const double *temporal_positions, const double *f0, int text_flag) {
  if (text_flag == 1) {
    FILE *fp = fopen(filename, "w");
    if (NULL == fp) {
      printf("File cannot be opened.\n");
      return;
    }
    for (int i = 0; i < f0_length; ++i)
      fprintf(fp, "%.5f %.5f\r\n", temporal_positions[i], f0[i]);
    fclose(fp);
  } else {
    FILE *fp = fopen(filename, "wb");
    if (NULL == fp) {
      printf("File cannot be opened.\n");
      return;
    }

    // Header
    fwrite("F0  ", 1, 4, fp);

    // Parameters
    WriteOneParameter(fp, "NOF ", f0_length, 4);
    WriteOneParameter(fp, "FP  ", frame_period, 8);

    // Data
    fwrite(f0, 8, f0_length, fp);
    fclose(fp);
  }
}